

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void xmlListReverse(xmlListPtr l)

{
  xmlLinkPtr local_20;
  xmlLinkPtr lkPrev;
  xmlLinkPtr lk;
  xmlListPtr l_local;
  
  if (l != (xmlListPtr)0x0) {
    local_20 = l->sentinel;
    for (lkPrev = l->sentinel->next; lkPrev != l->sentinel; lkPrev = lkPrev->next) {
      local_20->next = local_20->prev;
      local_20->prev = lkPrev;
      local_20 = lkPrev;
    }
    local_20->next = local_20->prev;
    local_20->prev = lkPrev;
  }
  return;
}

Assistant:

void
xmlListReverse(xmlListPtr l)
{
    xmlLinkPtr lk;
    xmlLinkPtr lkPrev;

    if (l == NULL)
        return;
    lkPrev = l->sentinel;
    for (lk = l->sentinel->next; lk != l->sentinel; lk = lk->next) {
        lkPrev->next = lkPrev->prev;
        lkPrev->prev = lk;
        lkPrev = lk;
    }
    /* Fix up the last node */
    lkPrev->next = lkPrev->prev;
    lkPrev->prev = lk;
}